

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall
Js::Type::Type(Type *this,ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
              JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *ptr;
  undefined4 *puVar4;
  Type local_50;
  nullptr_t local_38;
  Type local_30;
  JavascriptMethod entryPoint_local;
  RecyclableObject *prototype_local;
  ScriptContext *pSStack_18;
  TypeId typeId_local;
  ScriptContext *scriptContext_local;
  Type *this_local;
  
  this->typeId = typeId;
  this->flags = TypeFlagMask_None;
  local_30 = (Type)entryPoint;
  entryPoint_local = (JavascriptMethod)prototype;
  prototype_local._4_4_ = typeId;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  ptr = ScriptContext::GetLibrary(scriptContext);
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierPtr(&this->javascriptLibrary,ptr);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr
            (&this->prototype,(RecyclableObject *)entryPoint_local);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::TypePropertyCache>::WriteBarrierPtr(&this->propertyCache,&local_38);
  if (prototype_local._4_4_ < TypeIds_Limit) {
    pSStack_18->typeCount[prototype_local._4_4_] = pSStack_18->typeCount[prototype_local._4_4_] + 1;
  }
  if (local_30 == (Type)0x0) {
    local_50 = RecyclableObject::DefaultEntryPoint;
  }
  else {
    local_50 = local_30;
  }
  this->entryPoint = local_50;
  if (entryPoint_local != (JavascriptMethod)0x0) {
    BVar3 = CrossSite::NeedMarshalVar(entryPoint_local,pSStack_18);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/Type.cpp"
                                  ,0x22,"(! CrossSite::NeedMarshalVar(prototype,scriptContext))",
                                  "! CrossSite::NeedMarshalVar(prototype,scriptContext)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    RecyclableObject::SetIsPrototype((RecyclableObject *)entryPoint_local);
  }
  return;
}

Assistant:

Type::Type(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint) :
        javascriptLibrary(scriptContext->GetLibrary()),
        typeId(typeId),
        prototype(prototype),
        propertyCache(nullptr),
        flags(TypeFlagMask_None)
    {
#ifdef PROFILE_TYPES
        if (typeId < sizeof(scriptContext->typeCount)/sizeof(int))
        {
            scriptContext->typeCount[typeId]++;
        }
#endif
        this->entryPoint = entryPoint != nullptr ? entryPoint : RecyclableObject::DefaultEntryPoint;
        if (prototype)
        {
            Assert(! CrossSite::NeedMarshalVar(prototype,scriptContext));
            prototype->SetIsPrototype();
        }
    }